

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlatMap.h
# Opt level: O3

void __thiscall
FlatMap<double,MyStruct,std::less<double>>::insert<std::pair<double,MyStruct>const*>
          (FlatMap<double,MyStruct,std::less<double>> *this,pair<double,_MyStruct> *first,
          pair<double,_MyStruct> *last)

{
  double dVar1;
  long lVar2;
  pair<double,_MyStruct> *ppVar3;
  iterator __first;
  long lVar4;
  pair<double,_MyStruct> *ppVar5;
  iterator __last;
  MyStruct *pMVar6;
  long lVar7;
  pair<double,_MyStruct> *ppVar8;
  MyStruct *pMVar9;
  pair<double,_MyStruct> *ppVar10;
  __normal_iterator<std::pair<double,_MyStruct>_*,_std::vector<std::pair<double,_MyStruct>,_std::allocator<std::pair<double,_MyStruct>_>_>_>
  __seed;
  byte bVar11;
  double dVar12;
  _Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<double,_MyStruct>_*,_std::vector<std::pair<double,_MyStruct>,_std::allocator<std::pair<double,_MyStruct>_>_>_>,_std::pair<double,_MyStruct>_>
  _Stack_38;
  
  bVar11 = 0;
  if (first != last) {
    lVar4 = *(long *)(this + 8);
    lVar2 = *(long *)this;
    std::vector<std::pair<double,MyStruct>,std::allocator<std::pair<double,MyStruct>>>::
    _M_range_insert<std::pair<double,MyStruct>const*>
              ((vector<std::pair<double,MyStruct>,std::allocator<std::pair<double,MyStruct>>> *)this
               ,lVar4,first,last);
    lVar7 = *(long *)this;
    ppVar3 = *(pair<double,_MyStruct> **)(this + 8);
    __seed._M_current = (pair<double,_MyStruct> *)((lVar4 - lVar2) + lVar7);
    if (__seed._M_current != ppVar3) {
      lVar4 = ((long)ppVar3 - (long)__seed._M_current >> 4) * 0x6db6db6db6db6db7;
      std::
      _Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<double,_MyStruct>_*,_std::vector<std::pair<double,_MyStruct>,_std::allocator<std::pair<double,_MyStruct>_>_>_>,_std::pair<double,_MyStruct>_>
      ::_Temporary_buffer(&_Stack_38,__seed,(lVar4 - (lVar4 + 1 >> 0x3f)) + 1 >> 1);
      if (_Stack_38._M_buffer == (pointer)0x0) {
        std::
        __inplace_stable_sort<__gnu_cxx::__normal_iterator<std::pair<double,MyStruct>*,std::vector<std::pair<double,MyStruct>,std::allocator<std::pair<double,MyStruct>>>>,__gnu_cxx::__ops::_Iter_comp_iter<FlatMap<double,MyStruct,std::less<double>>::ValueToValueComparator>>
                  (__seed._M_current,ppVar3);
      }
      else {
        std::
        __stable_sort_adaptive<__gnu_cxx::__normal_iterator<std::pair<double,MyStruct>*,std::vector<std::pair<double,MyStruct>,std::allocator<std::pair<double,MyStruct>>>>,std::pair<double,MyStruct>*,long,__gnu_cxx::__ops::_Iter_comp_iter<FlatMap<double,MyStruct,std::less<double>>::ValueToValueComparator>>
                  (__seed._M_current,ppVar3,_Stack_38._M_buffer,_Stack_38._M_len);
      }
      operator_delete(_Stack_38._M_buffer);
      lVar7 = *(long *)this;
      ppVar3 = *(pair<double,_MyStruct> **)(this + 8);
    }
    std::
    __inplace_merge<__gnu_cxx::__normal_iterator<std::pair<double,MyStruct>*,std::vector<std::pair<double,MyStruct>,std::allocator<std::pair<double,MyStruct>>>>,__gnu_cxx::__ops::_Iter_comp_iter<FlatMap<double,MyStruct,std::less<double>>::ValueToValueComparator>>
              (lVar7,__seed._M_current,ppVar3);
    __first._M_current = *(pair<double,_MyStruct> **)this;
    ppVar3 = *(pair<double,_MyStruct> **)(this + 8);
    __last._M_current = __first._M_current;
    if (__first._M_current != ppVar3) {
      ppVar5 = __first._M_current + 1;
      do {
        ppVar10 = ppVar5;
        __first._M_current = ppVar3;
        __last._M_current = ppVar3;
        if (ppVar10 == ppVar3) goto LAB_0019a1f9;
        dVar12 = ppVar10[-1].first;
        ppVar5 = ppVar10 + 1;
      } while (dVar12 < ppVar10->first);
      ppVar10 = ppVar10 + -1;
      ppVar8 = ppVar10;
      if (ppVar5 != ppVar3) {
        do {
          dVar1 = ppVar5->first;
          ppVar10 = ppVar8;
          if (dVar12 < dVar1) {
            ppVar10 = ppVar8 + 1;
            ppVar8[1].first = dVar1;
            pMVar6 = &ppVar5->second;
            pMVar9 = &ppVar8[1].second;
            for (lVar4 = 0xd; dVar12 = dVar1, lVar4 != 0; lVar4 = lVar4 + -1) {
              *(undefined8 *)(pMVar9->data)._M_elems = *(undefined8 *)(pMVar6->data)._M_elems;
              pMVar6 = (MyStruct *)((long)pMVar6 + (ulong)bVar11 * -0x10 + 8);
              pMVar9 = (MyStruct *)((long)pMVar9 + (ulong)bVar11 * -0x10 + 8);
            }
          }
          ppVar5 = ppVar5 + 1;
          ppVar8 = ppVar10;
        } while (ppVar5 != ppVar3);
        ppVar3 = *(pair<double,_MyStruct> **)(this + 8);
      }
      __first._M_current = ppVar10 + 1;
      __last._M_current = ppVar3;
    }
LAB_0019a1f9:
    std::vector<std::pair<double,_MyStruct>,_std::allocator<std::pair<double,_MyStruct>_>_>::
    _M_erase((vector<std::pair<double,_MyStruct>,_std::allocator<std::pair<double,_MyStruct>_>_> *)
             this,__first,__last);
  }
  return;
}

Assistant:

void insert(InputIt first, InputIt last) {
        if (first == last) {
            return;
        }

        auto insertStart = vec_.insert(vec_.end(), first, last);
        std::stable_sort(insertStart, vec_.end(), valueToValueComp_);
        std::inplace_merge(vec_.begin(), insertStart, vec_.end(), valueToValueComp_);
        auto newLast = std::unique(vec_.begin(), vec_.end(), [this](const value_type& lhs, const value_type& rhs) {
            return !comp_(lhs.first, rhs.first);
        });
        vec_.erase(newLast, vec_.end());

        //mergeUnique(first, last);
    }